

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void detectAndDisplay(Mat *frame)

{
  reference pvVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  Rect_<int> local_1e0;
  Mat local_1d0 [100];
  int local_16c;
  int local_168;
  int i_1;
  int pos;
  int max;
  Rect_<int> local_140;
  _InputOutputArray local_130;
  int local_114;
  int i;
  Size_<int> local_108;
  _InputArray local_100;
  Mat local_e8 [8];
  Mat frame_gray;
  _OutputArray local_88;
  _InputArray local_70;
  allocator<cv::Mat> local_41;
  undefined1 local_40 [8];
  vector<cv::Mat,_std::allocator<cv::Mat>_> rgbChannels;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> faces;
  Mat *frame_local;
  
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
             &rgbChannels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::allocator<cv::Mat>::allocator(&local_41);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_40,3,&local_41);
  std::allocator<cv::Mat>::~allocator(&local_41);
  cv::_InputArray::_InputArray(&local_70,frame);
  cv::_OutputArray::_OutputArray(&local_88,(vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_40);
  cv::split(&local_70,&local_88);
  cv::_OutputArray::~_OutputArray(&local_88);
  cv::_InputArray::~_InputArray(&local_70);
  pvVar1 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                     ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_40,2);
  cv::Mat::Mat(local_e8,pvVar1);
  cv::_InputArray::_InputArray(&local_100,local_e8);
  cv::Size_<int>::Size_(&local_108,0x96,0x96);
  cv::Size_<int>::Size_((Size_<int> *)&stack0xfffffffffffffef0);
  cv::CascadeClassifier::detectMultiScale
            (0x3ff199999999999a,face_cascade,&local_100,
             &rgbChannels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,2,6,&local_108,&stack0xfffffffffffffef0);
  cv::_InputArray::~_InputArray(&local_100);
  local_114 = 0;
  while( true ) {
    uVar2 = (ulong)local_114;
    sVar3 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size
                      ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                       &rgbChannels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (sVar3 <= uVar2) break;
    cv::_InputOutputArray::_InputOutputArray(&local_130,(Mat *)debugImage);
    pvVar4 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                       ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                        &rgbChannels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)local_114);
    cv::Rect_<int>::Rect_(&local_140,pvVar4);
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)&pos,1234.0);
    cv::rectangle(&local_130,&local_140,&pos,1,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_130);
    local_114 = local_114 + 1;
  }
  sVar3 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size
                    ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                     &rgbChannels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (sVar3 != 0) {
    pvVar4 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                       ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                        &rgbChannels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
    i_1 = pvVar4->width;
    local_168 = 0;
    local_16c = 1;
    while( true ) {
      uVar2 = (ulong)local_16c;
      sVar3 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size
                        ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                         &rgbChannels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      if (sVar3 <= uVar2) break;
      pvVar4 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                          &rgbChannels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,(long)local_16c);
      if (i_1 < pvVar4->width) {
        pvVar4 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                           ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                            &rgbChannels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_16c);
        i_1 = pvVar4->width;
        local_168 = local_16c;
      }
      local_16c = local_16c + 1;
    }
    cv::Mat::Mat(local_1d0,local_e8);
    pvVar4 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                       ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                        &rgbChannels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
    cv::Rect_<int>::Rect_(&local_1e0,pvVar4);
    findEyes(local_1d0,&local_1e0);
    cv::Mat::~Mat(local_1d0);
  }
  cv::Mat::~Mat(local_e8);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_40);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
             &rgbChannels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void detectAndDisplay( cv::Mat frame ) {
  std::vector<cv::Rect> faces;
  //cv::Mat frame_gray;

  std::vector<cv::Mat> rgbChannels(3);
  cv::split(frame, rgbChannels);
  cv::Mat frame_gray = rgbChannels[2];

  //cvtColor( frame, frame_gray, CV_BGR2GRAY );
  //equalizeHist( frame_gray, frame_gray );
  //cv::pow(frame_gray, CV_64F, frame_gray);
  //-- Detect faces
  face_cascade.detectMultiScale( frame_gray, faces, 1.1, 2, 0|cv::CASCADE_SCALE_IMAGE|cv::CASCADE_FIND_BIGGEST_OBJECT, cv::Size(150, 150) );
//  findSkin(debugImage);



  for( int i = 0; i < faces.size(); i++ )
  {
    rectangle(debugImage, faces[i], 1234);
  }
  //-- Show what you got

  if (faces.size() > 0) {
    auto max = faces[0].width;
    int pos = 0;
    for(int i = 1; i < faces.size(); i++){
      if(faces[i].width > max){
        max = faces[i].width;
        pos = i;
      }
    }
    findEyes(frame_gray, faces[0]);
  }
}